

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrlib.c
# Opt level: O1

int btrunc(bstring b,int n)

{
  int iVar1;
  int iVar2;
  
  iVar2 = -1;
  if ((((b != (bstring)0x0 && -1 < n) && (b->data != (uchar *)0x0)) && (0 < b->mlen)) &&
     (((iVar1 = b->slen, iVar1 <= b->mlen && (-1 < iVar1)) && (iVar2 = 0, n < iVar1)))) {
    b->slen = n;
    b->data[(uint)n] = '\0';
  }
  return iVar2;
}

Assistant:

int btrunc (bstring b, int n) {
	if (n < 0 || b == NULL || b->data == NULL || b->mlen < b->slen ||
	    b->slen < 0 || b->mlen <= 0) return BSTR_ERR;
	if (b->slen > n) {
		b->slen = n;
		b->data[n] = (unsigned char) '\0';
	}
	return 0;
}